

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

void replay_all_hashes(ResourceTag tag,DatabaseInterface *db_iface,StateReplayer *replayer,
                      StateCreatorInterface *iface,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json,
                      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *filter)

{
  int iVar1;
  __node_base *p_Var2;
  pointer puVar3;
  allocator_type local_59;
  size_t size;
  Hash *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  
  if (filter != (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)0x0) {
    p_Var2 = &(filter->_M_h)._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      replay_hash(tag,(Hash)p_Var2[1]._M_nxt,db_iface,replayer,iface,state_json);
    }
    return;
  }
  iVar1 = (*db_iface->_vptr_DatabaseInterface[6])(db_iface,tag,&size,0);
  if ((char)iVar1 != '\0') {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&hashes,size,&local_59);
    iVar1 = (*db_iface->_vptr_DatabaseInterface[6])
                      (db_iface,tag,&size,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    if ((char)iVar1 != '\0') {
      local_50 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (puVar3 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start; puVar3 != local_50; puVar3 = puVar3 + 1) {
        replay_hash(tag,*puVar3,db_iface,replayer,iface,state_json);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
  }
  exit(1);
}

Assistant:

static void replay_all_hashes(ResourceTag tag, DatabaseInterface &db_iface,
                              StateReplayer &replayer, StateCreatorInterface &iface,
                              vector<uint8_t> &state_json,
                              const unordered_set<Hash> *filter)
{
	if (filter)
	{
		for (auto hash : *filter)
			replay_hash(tag, hash, db_iface, replayer, iface, state_json);
	}
	else
	{
		size_t size;
		if (!db_iface.get_hash_list_for_resource_tag(tag, &size, nullptr))
			exit(EXIT_FAILURE);

		vector<Hash> hashes(size);
		if (!db_iface.get_hash_list_for_resource_tag(tag, &size, hashes.data()))
			exit(EXIT_FAILURE);

		for (auto hash : hashes)
			replay_hash(tag, hash, db_iface, replayer, iface, state_json);
	}
}